

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O1

int FmsMeshFinalize(FmsMesh mesh)

{
  FmsInt *pFVar1;
  byte bVar2;
  short sVar3;
  ushort uVar4;
  FmsIntType FVar5;
  FmsDomain pFVar6;
  size_t sVar7;
  void *pvVar8;
  bool bVar9;
  uint uVar10;
  int extraout_EAX;
  FmsInt *pFVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  FmsOrientation *pFVar17;
  ulong uVar18;
  FmsOrientation *pFVar19;
  long extraout_RDX;
  ulong uVar20;
  undefined1 *puVar21;
  ulong uVar22;
  uint uVar23;
  ulong uVar24;
  void *in_R8;
  FmsInt *pFVar25;
  int loc_face_id;
  ulong in_R9;
  FmsOrientation FVar26;
  ulong uVar27;
  char cVar28;
  FmsInt FVar29;
  int iVar30;
  FmsInt off;
  ulong uVar31;
  long lVar32;
  int iVar33;
  ulong uVar34;
  long lVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  FmsInt aFStack_10218 [2041];
  undefined8 uStack_c250;
  FmsInt local_c218 [6143];
  code *pcStack_220;
  ulong auStack_218 [13];
  FmsInt tet_edges_sorted [4] [3];
  int aiStack_f8 [2];
  int nc [6];
  FmsOrientation *local_40;
  
  if (mesh == (FmsMesh)0x0) {
    in_R9 = 1;
  }
  else {
    if (mesh->num_domains != 0) {
      uVar18 = 0;
      do {
        pFVar6 = mesh->domains[uVar18];
        uVar22 = pFVar6->num_entities[2];
        if (uVar22 == 0) {
LAB_001041f9:
          uVar22 = pFVar6->num_entities[3];
          if (uVar22 != 0) {
            FVar5 = pFVar6->side_ids_type[3];
            if (FVar5 == pFVar6->side_ids_type[1]) {
              sVar7 = FmsIntTypeSize[FVar5];
              pvVar8 = pFVar6->entities[1];
              in_R8 = pFVar6->entities[3];
              local_40 = pFVar6->orientations[3];
              bVar38 = false;
              uVar31 = 0;
              uVar34 = uVar22;
              do {
                FVar29 = 0x400;
                if (uVar34 < 0x400) {
                  FVar29 = uVar34;
                }
                FmsEntitiesToSides(FVar5,4,0,4,in_R8,2,pvVar8,8,0,aFStack_10218,FVar29);
                uVar10 = FmsOrientFaceSides(4,FVar29,aFStack_10218,local_40);
                uVar23 = (uint)in_R9;
                if (uVar10 != 0) {
                  uVar23 = uVar10;
                }
                in_R9 = (ulong)uVar23;
                if (uVar10 != 0) break;
                in_R8 = (void *)((long)in_R8 + FVar29 * 4 * sVar7);
                local_40 = local_40 + FVar29 * 4;
                uVar31 = uVar31 + 0x400;
                uVar34 = uVar34 - 0x400;
                bVar38 = uVar31 >= uVar22;
              } while (uVar31 < uVar22);
            }
            else {
              in_R9 = 2;
              bVar38 = false;
            }
            if (!bVar38) goto LAB_00104c26;
          }
          uVar22 = pFVar6->num_entities[4];
          if (uVar22 != 0) {
            FVar5 = pFVar6->side_ids_type[4];
            if (FVar5 == pFVar6->side_ids_type[2]) {
              sVar7 = FmsIntTypeSize[FVar5];
              pvVar8 = pFVar6->entities[2];
              in_R8 = pFVar6->entities[4];
              pFVar17 = pFVar6->orientations[4];
              bVar38 = false;
              uVar34 = 0;
LAB_001043e2:
              uVar31 = uVar22 - uVar34;
              if (0x1ff < uVar31) {
                uVar31 = 0x200;
              }
              uStack_c250 = 0x10443a;
              FmsEntitiesToSides(FVar5,4,0,4,in_R8,3,pvVar8,0xc,0,local_c218,uVar31);
              bVar37 = true;
              uVar15 = 0;
              pFVar11 = local_c218;
              local_40 = pFVar17;
LAB_00104456:
              lVar12 = 0x10;
              do {
                uVar14 = *(ulong *)((long)pFVar11 + lVar12 + -0x10);
                uVar20 = *(ulong *)((long)pFVar11 + lVar12 + -8);
                uVar16 = *(ulong *)((long)pFVar11 + lVar12);
                if (uVar20 < uVar14) {
                  if (uVar20 < uVar16) {
                    *(ulong *)((long)auStack_218 + lVar12 + 0x50) = uVar20;
                    if (uVar14 <= uVar16) {
                      *(ulong *)((long)auStack_218 + lVar12 + 0x58) = uVar14;
                      goto LAB_001044ef;
                    }
                    *(ulong *)((long)auStack_218 + lVar12 + 0x58) = uVar16;
                  }
                  else {
                    *(ulong *)((long)auStack_218 + lVar12 + 0x50) = uVar16;
                    *(ulong *)((long)auStack_218 + lVar12 + 0x58) = uVar20;
                  }
                  *(ulong *)((long)tet_edges_sorted[-1] + lVar12 + 0x10) = uVar14;
                }
                else if (uVar16 < uVar20) {
                  uVar24 = uVar16;
                  if (uVar14 < uVar16) {
                    uVar24 = uVar14;
                  }
                  if (uVar16 < uVar14) {
                    uVar16 = uVar14;
                  }
                  *(ulong *)((long)auStack_218 + lVar12 + 0x50) = uVar24;
                  *(ulong *)((long)auStack_218 + lVar12 + 0x58) = uVar16;
                  *(ulong *)((long)tet_edges_sorted[-1] + lVar12 + 0x10) = uVar20;
                }
                else {
                  *(ulong *)((long)auStack_218 + lVar12 + 0x50) = uVar14;
                  *(ulong *)((long)auStack_218 + lVar12 + 0x58) = uVar20;
LAB_001044ef:
                  *(ulong *)((long)tet_edges_sorted[-1] + lVar12 + 0x10) = uVar16;
                }
                lVar12 = lVar12 + 0x18;
              } while (lVar12 != 0x70);
              uVar14 = 0;
              bVar36 = false;
LAB_0010450a:
              lVar12 = (long)(int)(&FmsOrientTetSides_tet_edge_face)[uVar14 * 2];
              lVar13 = (long)(int)(&DAT_001125e4)[uVar14 * 2];
              FVar29 = tet_edges_sorted[lVar12 + -1][2];
              uVar20 = tet_edges_sorted[lVar13 + -1][2];
              iVar33 = 0;
              lVar35 = 0;
              lVar32 = 0;
              do {
                while( true ) {
                  if (FVar29 == uVar20) break;
                  if (FVar29 < uVar20) {
                    lVar35 = (long)(int)lVar35;
                    do {
                      if (lVar35 == 2) goto LAB_001045ae;
                      FVar29 = tet_edges_sorted[lVar12][lVar35];
                      lVar35 = lVar35 + 1;
                    } while (FVar29 < uVar20);
                  }
                  else {
                    lVar32 = (long)(int)lVar32;
                    do {
                      if (lVar32 == 2) goto LAB_001045ae;
                      uVar20 = tet_edges_sorted[lVar13][lVar32];
                      lVar32 = lVar32 + 1;
                    } while (uVar20 < FVar29);
                  }
                }
                iVar33 = iVar33 + 1;
                auStack_218[uVar14] = FVar29;
                lVar32 = (long)(int)lVar32;
                do {
                  if (lVar32 == 2) goto LAB_001045ae;
                  uVar20 = tet_edges_sorted[lVar13][lVar32];
                  lVar32 = lVar32 + 1;
                } while (FVar29 == uVar20);
                lVar35 = (long)(int)lVar35;
                do {
                  if (lVar35 == 2) goto LAB_001045ae;
                  FVar29 = tet_edges_sorted[lVar12][lVar35];
                  lVar35 = lVar35 + 1;
                } while (FVar29 < uVar20);
              } while( true );
            }
            in_R9 = 2;
            bVar38 = false;
LAB_001047f3:
            if (!bVar38) goto LAB_00104c26;
          }
          uVar22 = pFVar6->num_entities[5];
          if (uVar22 != 0) {
            FVar5 = pFVar6->side_ids_type[5];
            if (FVar5 == pFVar6->side_ids_type[3]) {
              sVar7 = FmsIntTypeSize[FVar5];
              pvVar8 = pFVar6->entities[3];
              in_R8 = pFVar6->entities[5];
              pFVar17 = pFVar6->orientations[5];
              bVar38 = false;
              uVar34 = 0;
LAB_0010487e:
              uVar31 = uVar22 - uVar34;
              if (0xff < uVar31) {
                uVar31 = 0x100;
              }
              uStack_c250 = 0x1048d4;
              FmsEntitiesToSides(FVar5,6,0,6,in_R8,4,pvVar8,0x18,0,local_c218,uVar31);
              bVar37 = true;
              uVar15 = 0;
              pFVar11 = local_c218;
              pFVar19 = pFVar17;
LAB_001048e5:
              lVar12 = 0x18;
              do {
                uVar14 = *(ulong *)((long)pFVar11 + lVar12 + -0x18);
                uVar20 = *(ulong *)((long)pFVar11 + lVar12 + -0x10);
                uVar16 = uVar20;
                if (uVar14 >= uVar20 && uVar14 != uVar20) {
                  uVar16 = uVar14;
                }
                if (uVar14 < uVar20) {
                  uVar20 = uVar14;
                }
                uVar14 = *(ulong *)((long)pFVar11 + lVar12 + -8);
                uVar24 = *(ulong *)((long)pFVar11 + lVar12);
                uVar27 = uVar24;
                if (uVar14 < uVar24) {
                  uVar27 = uVar14;
                }
                if (uVar24 < uVar14) {
                  uVar24 = uVar14;
                }
                if (uVar27 < uVar20) {
                  *(ulong *)((long)auStack_218 + lVar12 + 0x48) = uVar27;
                  if (uVar20 < uVar24) {
                    *(ulong *)((long)auStack_218 + lVar12 + 0x50) = uVar20;
                    if (uVar24 <= uVar16) goto LAB_0010495c;
LAB_00104938:
                    *(ulong *)((long)auStack_218 + lVar12 + 0x58) = uVar16;
                    uVar16 = uVar24;
                  }
                  else {
                    *(ulong *)((long)auStack_218 + lVar12 + 0x50) = uVar24;
                    *(ulong *)((long)auStack_218 + lVar12 + 0x58) = uVar20;
                  }
                }
                else {
                  *(ulong *)((long)auStack_218 + lVar12 + 0x48) = uVar20;
                  if (uVar27 < uVar16) {
                    *(ulong *)((long)auStack_218 + lVar12 + 0x50) = uVar27;
                    if (uVar16 <= uVar24) goto LAB_00104938;
LAB_0010495c:
                    *(ulong *)((long)auStack_218 + lVar12 + 0x58) = uVar24;
                  }
                  else {
                    *(ulong *)((long)auStack_218 + lVar12 + 0x50) = uVar16;
                    *(ulong *)((long)auStack_218 + lVar12 + 0x58) = uVar27;
                    uVar16 = uVar24;
                  }
                }
                *(ulong *)((long)tet_edges_sorted[-1] + lVar12 + 0x10) = uVar16;
                lVar12 = lVar12 + 0x20;
              } while (lVar12 != 0xd8);
              uVar14 = 0;
              bVar36 = false;
LAB_001049a9:
              uVar20 = *(ulong *)((long)tet_edges_sorted +
                                 (long)(int)(&FmsOrientHexSides_hex_edge_face)[uVar14 * 2] * 0x20 +
                                 -8);
              uVar16 = *(ulong *)((long)tet_edges_sorted +
                                 (long)(int)(&DAT_00112654)[uVar14 * 2] * 0x20 + -8);
              lVar12 = (long)(int)(&DAT_00112654)[uVar14 * 2] * 0x20 + -0x1b0;
              lVar13 = (long)(int)(&FmsOrientHexSides_hex_edge_face)[uVar14 * 2] * 0x20 + -0x1b0;
              iVar33 = 0;
              lVar35 = 0;
              lVar32 = 0;
              do {
                while( true ) {
                  if (uVar20 == uVar16) break;
                  if (uVar20 < uVar16) {
                    lVar35 = (long)(int)lVar35;
                    do {
                      if (lVar35 == 3) goto LAB_00104a4c;
                      uVar20 = *(ulong *)((long)tet_edges_sorted + lVar35 * 8 + lVar13 + 0x1b0);
                      lVar35 = lVar35 + 1;
                    } while (uVar20 < uVar16);
                  }
                  else {
                    lVar32 = (long)(int)lVar32;
                    do {
                      if (lVar32 == 3) goto LAB_00104a4c;
                      uVar16 = *(ulong *)((long)tet_edges_sorted + lVar32 * 8 + lVar12 + 0x1b0);
                      lVar32 = lVar32 + 1;
                    } while (uVar16 < uVar20);
                  }
                }
                iVar33 = iVar33 + 1;
                auStack_218[uVar14] = uVar20;
                lVar32 = (long)(int)lVar32;
                do {
                  if (lVar32 == 3) goto LAB_00104a4c;
                  uVar16 = *(ulong *)((long)tet_edges_sorted + lVar32 * 8 + lVar12 + 0x1b0);
                  lVar32 = lVar32 + 1;
                } while (uVar20 == uVar16);
                lVar35 = (long)(int)lVar35;
                do {
                  if (lVar35 == 3) goto LAB_00104a4c;
                  uVar20 = *(ulong *)((long)tet_edges_sorted + lVar35 * 8 + lVar13 + 0x1b0);
                  lVar35 = lVar35 + 1;
                } while (uVar20 < uVar16);
              } while( true );
            }
            in_R9 = 2;
            bVar38 = false;
LAB_00104c10:
            if (!bVar38) goto LAB_00104c26;
          }
          if (pFVar6->num_entities[6] != 0) {
            pcStack_220 = (code *)0x104c5a;
            FmsMeshFinalize_cold_1();
LAB_00104c5a:
            uVar23 = (uint)mesh;
            pcStack_220 = FmsEntitiesToSides;
            FmsMeshFinalize_cold_2();
            iVar33 = extraout_EAX;
            if (uVar23 < 8) {
              lVar12 = auStack_218[4] + auStack_218[3] * 8;
              uVar34 = auStack_218[5];
              switch(uVar23) {
              case 0:
                if (auStack_218[5] != 0) {
                  uVar31 = 0;
                  do {
                    if (uVar18 != 0) {
                      uVar15 = 0;
                      lVar13 = lVar12;
                      do {
                        if (in_R9 != 0) {
                          cVar28 = *(char *)((long)in_R8 + uVar15 + uVar31 * uVar22 + extraout_RDX);
                          uVar14 = 0;
                          do {
                            uVar34 = (ulong)*(char *)((long)cVar28 * in_R9 + auStack_218[1] + uVar14
                                                     );
                            *(ulong *)(lVar13 + uVar14 * 8) = uVar34;
                            uVar14 = uVar14 + 1;
                          } while (in_R9 != uVar14);
                        }
                        uVar15 = uVar15 + 1;
                        lVar13 = lVar13 + in_R9 * 8;
                      } while (uVar15 != uVar18);
                    }
                    uVar31 = uVar31 + 1;
                    lVar12 = lVar12 + auStack_218[2] * 8;
                  } while (uVar31 != auStack_218[5]);
                }
                break;
              case 1:
                if (auStack_218[5] != 0) {
                  uVar31 = 0;
                  do {
                    if (uVar18 != 0) {
                      uVar34 = uVar31 * uVar22;
                      lVar13 = uVar34 * 2;
                      uVar15 = 0;
                      lVar32 = lVar12;
                      do {
                        if (in_R9 != 0) {
                          sVar3 = *(short *)((long)in_R8 + uVar15 * 2 + lVar13 + extraout_RDX * 2);
                          uVar14 = 0;
                          do {
                            uVar34 = (ulong)*(short *)(auStack_218[1] + (long)sVar3 * in_R9 * 2 +
                                                      uVar14 * 2);
                            *(ulong *)(lVar32 + uVar14 * 8) = uVar34;
                            uVar14 = uVar14 + 1;
                          } while (in_R9 != uVar14);
                        }
                        uVar15 = uVar15 + 1;
                        lVar32 = lVar32 + in_R9 * 8;
                      } while (uVar15 != uVar18);
                    }
                    uVar31 = uVar31 + 1;
                    lVar12 = lVar12 + auStack_218[2] * 8;
                  } while (uVar31 != auStack_218[5]);
                }
                break;
              case 2:
                if (auStack_218[5] != 0) {
                  uVar31 = 0;
                  do {
                    if (uVar18 != 0) {
                      uVar34 = uVar31 * uVar22;
                      lVar13 = uVar34 * 4;
                      uVar15 = 0;
                      lVar32 = lVar12;
                      do {
                        if (in_R9 != 0) {
                          iVar33 = *(int *)((long)in_R8 + uVar15 * 4 + lVar13 + extraout_RDX * 4);
                          uVar14 = 0;
                          do {
                            uVar34 = (ulong)*(int *)(auStack_218[1] + (long)iVar33 * in_R9 * 4 +
                                                    uVar14 * 4);
                            *(ulong *)(lVar32 + uVar14 * 8) = uVar34;
                            uVar14 = uVar14 + 1;
                          } while (in_R9 != uVar14);
                        }
                        uVar15 = uVar15 + 1;
                        lVar32 = lVar32 + in_R9 * 8;
                      } while (uVar15 != uVar18);
                    }
                    uVar31 = uVar31 + 1;
                    lVar12 = lVar12 + auStack_218[2] * 8;
                  } while (uVar31 != auStack_218[5]);
                }
                break;
              case 3:
                if (auStack_218[5] != 0) {
                  uVar31 = 0;
                  do {
                    if (uVar18 != 0) {
                      uVar34 = uVar31 * uVar22;
                      lVar13 = uVar34 * 8;
                      uVar15 = 0;
                      lVar32 = lVar12;
                      do {
                        if (in_R9 != 0) {
                          lVar35 = *(long *)((long)in_R8 + uVar15 * 8 + lVar13 + extraout_RDX * 8);
                          uVar14 = 0;
                          do {
                            uVar34 = *(ulong *)(auStack_218[1] + lVar35 * in_R9 * 8 + uVar14 * 8);
                            *(ulong *)(lVar32 + uVar14 * 8) = uVar34;
                            uVar14 = uVar14 + 1;
                          } while (in_R9 != uVar14);
                        }
                        uVar15 = uVar15 + 1;
                        lVar32 = lVar32 + in_R9 * 8;
                      } while (uVar15 != uVar18);
                    }
                    uVar31 = uVar31 + 1;
                    lVar12 = lVar12 + auStack_218[2] * 8;
                  } while (uVar31 != auStack_218[5]);
                }
                break;
              case 4:
                if (auStack_218[5] != 0) {
                  uVar31 = 0;
                  do {
                    if (uVar18 != 0) {
                      uVar15 = 0;
                      lVar13 = lVar12;
                      do {
                        if (in_R9 != 0) {
                          bVar2 = *(byte *)((long)in_R8 + uVar15 + uVar31 * uVar22 + extraout_RDX);
                          uVar14 = 0;
                          do {
                            uVar34 = (ulong)*(byte *)(bVar2 * in_R9 + auStack_218[1] + uVar14);
                            *(ulong *)(lVar13 + uVar14 * 8) = uVar34;
                            uVar14 = uVar14 + 1;
                          } while (in_R9 != uVar14);
                        }
                        uVar15 = uVar15 + 1;
                        lVar13 = lVar13 + in_R9 * 8;
                      } while (uVar15 != uVar18);
                    }
                    uVar31 = uVar31 + 1;
                    lVar12 = lVar12 + auStack_218[2] * 8;
                  } while (uVar31 != auStack_218[5]);
                }
                break;
              case 5:
                if (auStack_218[5] != 0) {
                  uVar31 = 0;
                  do {
                    if (uVar18 != 0) {
                      uVar34 = uVar31 * uVar22;
                      lVar13 = uVar34 * 2;
                      uVar15 = 0;
                      lVar32 = lVar12;
                      do {
                        if (in_R9 != 0) {
                          uVar4 = *(ushort *)((long)in_R8 + uVar15 * 2 + lVar13 + extraout_RDX * 2);
                          uVar14 = 0;
                          do {
                            uVar34 = (ulong)*(ushort *)
                                             (auStack_218[1] + uVar4 * in_R9 * 2 + uVar14 * 2);
                            *(ulong *)(lVar32 + uVar14 * 8) = uVar34;
                            uVar14 = uVar14 + 1;
                          } while (in_R9 != uVar14);
                        }
                        uVar15 = uVar15 + 1;
                        lVar32 = lVar32 + in_R9 * 8;
                      } while (uVar15 != uVar18);
                    }
                    uVar31 = uVar31 + 1;
                    lVar12 = lVar12 + auStack_218[2] * 8;
                  } while (uVar31 != auStack_218[5]);
                }
                break;
              case 6:
                if (auStack_218[5] != 0) {
                  uVar31 = 0;
                  do {
                    if (uVar18 != 0) {
                      uVar34 = uVar31 * uVar22;
                      lVar13 = uVar34 * 4;
                      uVar15 = 0;
                      lVar32 = lVar12;
                      do {
                        if (in_R9 != 0) {
                          uVar23 = *(uint *)((long)in_R8 + uVar15 * 4 + lVar13 + extraout_RDX * 4);
                          uVar14 = 0;
                          do {
                            uVar34 = (ulong)*(uint *)(auStack_218[1] + uVar23 * in_R9 * 4 +
                                                     uVar14 * 4);
                            *(ulong *)(lVar32 + uVar14 * 8) = uVar34;
                            uVar14 = uVar14 + 1;
                          } while (in_R9 != uVar14);
                        }
                        uVar15 = uVar15 + 1;
                        lVar32 = lVar32 + in_R9 * 8;
                      } while (uVar15 != uVar18);
                    }
                    uVar31 = uVar31 + 1;
                    lVar12 = lVar12 + auStack_218[2] * 8;
                  } while (uVar31 != auStack_218[5]);
                }
                break;
              case 7:
                if (auStack_218[5] != 0) {
                  uVar31 = 0;
                  do {
                    if (uVar18 != 0) {
                      uVar34 = uVar31 * uVar22;
                      lVar13 = uVar34 * 8;
                      uVar15 = 0;
                      lVar32 = lVar12;
                      do {
                        if (in_R9 != 0) {
                          lVar35 = *(long *)((long)in_R8 + uVar15 * 8 + lVar13 + extraout_RDX * 8);
                          uVar14 = 0;
                          do {
                            uVar34 = *(ulong *)(auStack_218[1] + lVar35 * in_R9 * 8 + uVar14 * 8);
                            *(ulong *)(lVar32 + uVar14 * 8) = uVar34;
                            uVar14 = uVar14 + 1;
                          } while (in_R9 != uVar14);
                        }
                        uVar15 = uVar15 + 1;
                        lVar32 = lVar32 + in_R9 * 8;
                      } while (uVar15 != uVar18);
                    }
                    uVar31 = uVar31 + 1;
                    lVar12 = lVar12 + auStack_218[2] * 8;
                  } while (uVar31 != auStack_218[5]);
                }
              }
              iVar33 = (int)uVar34;
            }
            return iVar33;
          }
          bVar38 = true;
          if (pFVar6->num_entities[7] != 0) goto LAB_00104c5a;
        }
        else {
          FVar5 = pFVar6->side_ids_type[2];
          if (FVar5 == pFVar6->side_ids_type[1]) {
            sVar7 = FmsIntTypeSize[FVar5];
            pvVar8 = pFVar6->entities[1];
            in_R8 = pFVar6->entities[2];
            local_40 = pFVar6->orientations[2];
            bVar38 = false;
            uVar31 = 0;
            uVar34 = uVar22;
            do {
              FVar29 = 0x400;
              if (uVar34 < 0x400) {
                FVar29 = uVar34;
              }
              uStack_c250 = 0x10416e;
              FmsEntitiesToSides(FVar5,3,0,3,in_R8,2,pvVar8,6,0,local_c218,FVar29);
              uVar10 = FmsOrientFaceSides(3,FVar29,local_c218,local_40);
              uVar23 = (uint)in_R9;
              if (uVar10 != 0) {
                uVar23 = uVar10;
              }
              in_R9 = (ulong)uVar23;
              if (uVar10 != 0) break;
              local_40 = local_40 + FVar29 * 3;
              in_R8 = (void *)((long)in_R8 + FVar29 * 3 * sVar7);
              uVar31 = uVar31 + 0x400;
              uVar34 = uVar34 - 0x400;
              bVar38 = uVar31 >= uVar22;
            } while (uVar31 < uVar22);
          }
          else {
            in_R9 = 2;
            bVar38 = false;
          }
          if (bVar38) goto LAB_001041f9;
LAB_00104c26:
          bVar38 = false;
        }
        if (!bVar38) goto LAB_00104c43;
        uVar18 = uVar18 + 1;
      } while (uVar18 < mesh->num_domains);
    }
    in_R9 = 0;
  }
LAB_00104c43:
  return (int)in_R9;
LAB_001045ae:
  aiStack_f8[uVar14] = iVar33;
  if (iVar33 == 0) {
    if (!bVar36) goto LAB_00104755;
    goto LAB_001045e0;
  }
  bVar36 = 4 < uVar14;
  uVar14 = uVar14 + 1;
  if (uVar14 == 6) goto LAB_001045e0;
  goto LAB_0010450a;
LAB_001045e0:
  lVar12 = 0;
  pFVar25 = pFVar11;
  do {
    FVar26 = 0xff;
    if ((pFVar11[lVar12 * 3] != pFVar11[lVar12 * 3 + 1]) &&
       (pFVar11[lVar12 * 3 + 1] != pFVar11[lVar12 * 3 + 2] &&
        pFVar11[lVar12 * 3] != pFVar11[lVar12 * 3 + 2])) {
      if (aiStack_f8[(int)(&FmsOrientTetSides_tet_face_edge)[lVar12 * 3]] == 1) {
        iVar33 = -1;
        uVar14 = 0;
        do {
          iVar33 = iVar33 + 1;
          uVar20 = uVar14 + 2;
          lVar13 = uVar14 * 4;
          uVar14 = uVar20;
        } while (auStack_218[(int)(&FmsOrientTetSides_tet_face_edge)[lVar12 * 3]] !=
                 *(ulong *)((long)pFVar25 + lVar13));
        iVar30 = 1;
        FVar29 = auStack_218[(int)(&DAT_00112614)[lVar12 * 3]];
        if (aiStack_f8[(int)(&DAT_00112614)[lVar12 * 3]] == 1) {
LAB_0010469c:
          uVar20 = (ulong)(byte)(((char)uVar20 +
                                 (pFVar11[lVar12 * 3 +
                                          (ulong)(iVar30 + ((uint)(iVar30 + iVar33) / 3) * -3 +
                                                 iVar33)] != FVar29)) - 2);
          bVar9 = false;
        }
        else {
          bVar9 = true;
          iVar30 = 2;
          FVar29 = auStack_218[(int)(&DAT_00112618)[lVar12 * 3]];
          if (aiStack_f8[(int)(&DAT_00112618)[lVar12 * 3]] == 1) goto LAB_0010469c;
        }
        FVar26 = (FmsOrientation)uVar20;
        if (!bVar9) goto LAB_00104727;
      }
      else if ((aiStack_f8[(int)(&DAT_00112614)[lVar12 * 3]] == 1) &&
              (aiStack_f8[(int)(&DAT_00112618)[lVar12 * 3]] == 1)) {
        uVar14 = 0;
        do {
          uVar20 = uVar14;
          uVar14 = uVar20 + 1;
        } while (auStack_218[(int)(&DAT_00112614)[lVar12 * 3]] != pFVar25[uVar20]);
        puVar21 = &GetTriangleOrientation_oo_24;
        if (pFVar11[lVar12 * 3 + (ulong)(uint)((int)uVar14 + (int)((uVar14 & 0xffffffff) / 3) * -3)]
            == auStack_218[(int)(&DAT_00112618)[lVar12 * 3]]) {
          puVar21 = &GetTriangleOrientation_oo;
        }
        FVar26 = puVar21[uVar20];
        goto LAB_00104727;
      }
      FVar26 = 0xff;
    }
LAB_00104727:
    if (FVar26 != 0xff) {
      local_40[lVar12] = FVar26;
    }
    lVar12 = lVar12 + 1;
    pFVar25 = pFVar25 + 3;
  } while (lVar12 != 4);
  pFVar11 = pFVar11 + 0xc;
  local_40 = local_40 + 4;
LAB_00104755:
  if (!bVar36) goto LAB_00104774;
  uVar15 = uVar15 + 1;
  bVar37 = uVar15 < uVar31;
  if (uVar15 == uVar31) goto LAB_00104774;
  goto LAB_00104456;
LAB_00104774:
  uVar23 = (uint)in_R9;
  if (bVar37) {
    uVar23 = 1;
  }
  in_R9 = (ulong)uVar23;
  if (bVar37) goto LAB_001047f3;
  in_R8 = (void *)((long)in_R8 + uVar31 * 4 * sVar7);
  pFVar17 = pFVar17 + uVar31 * 4;
  uVar34 = uVar34 + 0x200;
  bVar38 = uVar22 <= uVar34;
  if (bVar38) goto LAB_001047f3;
  goto LAB_001043e2;
LAB_00104a4c:
  aiStack_f8[uVar14] = iVar33;
  if (iVar33 == 0) {
    if (!bVar36) goto LAB_00104b7b;
    goto LAB_00104a7e;
  }
  bVar36 = 10 < uVar14;
  uVar14 = uVar14 + 1;
  if (uVar14 == 0xc) goto LAB_00104a7e;
  goto LAB_001049a9;
LAB_00104a7e:
  lVar12 = 0;
  pFVar25 = pFVar11;
  do {
    lVar13 = lVar12 * 0x20;
    FVar26 = 0xff;
    if (((*(long *)((long)tet_edges_sorted + lVar13 + -8) !=
          *(long *)((long)tet_edges_sorted + lVar13)) &&
        (lVar32 = *(long *)((long)tet_edges_sorted + lVar13 + 8),
        *(long *)((long)tet_edges_sorted + lVar13) != lVar32)) &&
       (lVar32 != *(long *)((long)tet_edges_sorted + lVar13 + 0x10))) {
      if (((aiStack_f8[(int)(&FmsOrientHexSides_hex_face_edge)[lVar12 * 4]] == 1) &&
          (aiStack_f8[(int)(&DAT_001126b4)[lVar12 * 4]] == 1)) &&
         ((aiStack_f8[(int)(&DAT_001126b8)[lVar12 * 4]] == 1 &&
          (aiStack_f8[(int)(&DAT_001126bc)[lVar12 * 4]] == 1)))) {
        cVar28 = -2;
        lVar13 = 0;
        do {
          lVar32 = lVar13 + 1;
          cVar28 = cVar28 + '\x02';
          pFVar1 = pFVar25 + lVar13;
          lVar13 = lVar32;
        } while (auStack_218[(int)(&FmsOrientHexSides_hex_face_edge)[lVar12 * 4]] != *pFVar1);
        FVar26 = (pFVar11[lVar12 * 4 + (ulong)((uint)lVar32 & 3)] !=
                 auStack_218[(int)(&DAT_001126b4)[lVar12 * 4]]) + cVar28;
      }
    }
    if (FVar26 != 0xff) {
      pFVar19[lVar12] = FVar26;
    }
    lVar12 = lVar12 + 1;
    pFVar25 = pFVar25 + 4;
  } while (lVar12 != 6);
  pFVar11 = pFVar11 + 0x18;
  pFVar19 = pFVar19 + 6;
LAB_00104b7b:
  if (!bVar36) goto LAB_00104b96;
  uVar15 = uVar15 + 1;
  bVar37 = uVar15 < uVar31;
  if (uVar15 == uVar31) goto LAB_00104b96;
  goto LAB_001048e5;
LAB_00104b96:
  uVar23 = (uint)in_R9;
  if (bVar37) {
    uVar23 = 1;
  }
  in_R9 = (ulong)uVar23;
  if (bVar37) goto LAB_00104c10;
  pFVar17 = pFVar17 + uVar31 * 6;
  in_R8 = (void *)((long)in_R8 + uVar31 * 6 * sVar7);
  uVar34 = uVar34 + 0x100;
  bVar38 = uVar22 <= uVar34;
  if (bVar38) goto LAB_00104c10;
  goto LAB_0010487e;
}

Assistant:

int FmsMeshFinalize(FmsMesh mesh) {
  if (!mesh) { E_RETURN(1); }
  // Generate the side entity orientations for all entities in all domains
  for (FmsInt domain_id = 0; domain_id < mesh->num_domains; domain_id++) {
    FmsDomain domain = mesh->domains[domain_id];
    // Triangles
    if (domain->num_entities[FMS_TRIANGLE]) {
      const FmsEntityType et = FMS_TRIANGLE;
      const FmsIntType side_ids_type = domain->side_ids_type[et];
      if (side_ids_type != domain->side_ids_type[FMS_EDGE]) { E_RETURN(2); }
      const size_t sizeof_side_ids = FmsIntTypeSize[side_ids_type];
      const FmsInt num_tri = domain->num_entities[et];
      const char *all_tris = domain->entities[et];
      const void *all_edges = domain->entities[FMS_EDGE];
      FmsOrientation *oris = domain->orientations[et];
      const int bsize = 1024;
      FmsInt tri_verts[6*bsize];
      for (FmsInt off = 0; off < num_tri; off += bsize) {
        const FmsInt sz = FmsIntMin(bsize, num_tri-off);
        FmsEntitiesToSides(side_ids_type, 3, 0, 3, all_tris, 2, all_edges,
                           6, 0, tri_verts, sz);
        int err = FmsOrientFaceSides(3, sz, tri_verts, oris);
        if (err) { E_RETURN(err); }
        // TODO: create/update a list of the unknown side orientations
        all_tris += 3*sz*sizeof_side_ids;
        oris += 3*sz;
      }
    }
    // Quads
    if (domain->num_entities[FMS_QUADRILATERAL]) {
      const FmsEntityType et = FMS_QUADRILATERAL;
      const FmsIntType side_ids_type = domain->side_ids_type[et];
      if (side_ids_type != domain->side_ids_type[FMS_EDGE]) { E_RETURN(2); }
      const size_t sizeof_side_ids = FmsIntTypeSize[side_ids_type];
      const FmsInt num_quads = domain->num_entities[et];
      const char *all_quads = domain->entities[et];
      const void *all_edges = domain->entities[FMS_EDGE];
      FmsOrientation *oris = domain->orientations[et];
      const int bsize = 1024;
      FmsInt quad_verts[8*bsize];
      for (FmsInt off = 0; off < num_quads; off += bsize) {
        const FmsInt sz = FmsIntMin(bsize, num_quads-off);
        FmsEntitiesToSides(side_ids_type, 4, 0, 4, all_quads, 2, all_edges,
                           8, 0, quad_verts, sz);
        int err = FmsOrientFaceSides(4, sz, quad_verts, oris);
        if (err) { E_RETURN(err); }
        // TODO: create/update a list of the unknown side orientations
        all_quads += 4*sz*sizeof_side_ids;
        oris += 4*sz;
      }
    }
    // Tets
    if (domain->num_entities[FMS_TETRAHEDRON]) {
      const FmsEntityType et = FMS_TETRAHEDRON;
      const FmsIntType side_ids_type = domain->side_ids_type[et];
      if (side_ids_type != domain->side_ids_type[FMS_TRIANGLE]) { E_RETURN(2); }
      const size_t sizeof_side_ids = FmsIntTypeSize[side_ids_type];
      const FmsInt num_tets = domain->num_entities[et];
      const char *all_tets = domain->entities[et];
      const void *all_tris = domain->entities[FMS_TRIANGLE];
      FmsOrientation *oris = domain->orientations[et];
      const int bsize = 512;
      FmsInt tet_edges[12*bsize];
      for (FmsInt off = 0; off < num_tets; off += bsize) {
        const FmsInt sz = FmsIntMin(bsize, num_tets-off);
        FmsEntitiesToSides(side_ids_type, 4, 0, 4, all_tets, 3, all_tris,
                           12, 0, tet_edges, sz);
        int err = FmsOrientTetSides(sz, tet_edges, oris);
        if (err) { E_RETURN(err); }
        // TODO: create/update a list of the unknown side orientations
        all_tets += 4*sz*sizeof_side_ids;
        oris += 4*sz;
      }
    }
    // Hexes
    if (domain->num_entities[FMS_HEXAHEDRON]) {
      const FmsEntityType et = FMS_HEXAHEDRON;
      const FmsIntType side_ids_type = domain->side_ids_type[et];
      if (side_ids_type != domain->side_ids_type[FMS_QUADRILATERAL]) {
        E_RETURN(2);
      }
      const size_t sizeof_side_ids = FmsIntTypeSize[side_ids_type];
      const FmsInt num_hexes = domain->num_entities[et];
      const char *all_hexes = domain->entities[et];
      const void *all_quads = domain->entities[FMS_QUADRILATERAL];
      FmsOrientation *oris = domain->orientations[et];
      const int bsize = 256;
      FmsInt hex_edges[24*bsize];
      for (FmsInt off = 0; off < num_hexes; off += bsize) {
        const FmsInt sz = FmsIntMin(bsize, num_hexes-off);
        FmsEntitiesToSides(side_ids_type, 6, 0, 6, all_hexes, 4, all_quads,
                           24, 0, hex_edges, sz);
        int err = FmsOrientHexSides(sz, hex_edges, oris);
        if (err) { E_RETURN(err); }
        // TODO: create/update a list of the unknown side orientations
        all_hexes += 6*sz*sizeof_side_ids;
        oris += 6*sz;
      }
    }
    // Wedges
    if (domain->num_entities[FMS_WEDGE]) {
      // TODO ...
      FmsAbortNotImplemented();
    }
    // Pyramids
    if (domain->num_entities[FMS_PYRAMID]) {
      // TODO ...
      FmsAbortNotImplemented();
    }
  }
  // TODO ...
  return 0;
}